

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederate::registerTargetedEndpoint
          (MessageFederate *this,string_view eptName,string_view type)

{
  string_view addition;
  Endpoint *pEVar1;
  char *in_RSI;
  MessageFederateManager *in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  string_view in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Federate *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __sv_type local_38;
  char *local_10;
  
  local_10 = in_RSI;
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  operator->((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              *)0x267fa4);
  this_00 = &local_58;
  addition._M_str = local_10;
  addition._M_len = in_stack_ffffffffffffff90;
  Federate::localNameGenerator_abi_cxx11_(in_stack_ffffffffffffff88,addition);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  pEVar1 = MessageFederateManager::registerTargetedEndpoint
                     (in_stack_00000048,in_stack_00000060,(string_view)in_stack_00000050);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  return pEVar1;
}

Assistant:

Endpoint& MessageFederate::registerTargetedEndpoint(std::string_view eptName, std::string_view type)
{
    return mfManager->registerTargetedEndpoint(localNameGenerator(eptName), type);
}